

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall pbrt::syntactic::Token::Token(Token *this,Token *other)

{
  Loc::Loc(&this->loc,&other->loc);
  this->type = other->type;
  std::__cxx11::string::string((string *)&this->text,(string *)&other->text);
  return;
}

Assistant:

Token(const Token &other) = default;